

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testMissingUpdatableModelParameters(void)

{
  bool bVar1;
  ostream *poVar2;
  NeuralNetwork *nn;
  int iVar3;
  Result res;
  Model m;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Model local_60;
  undefined1 local_30 [8];
  _Alloc_hider local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18;
  
  CoreML::Specification::Model::Model(&local_60);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(&local_60);
  CoreML::Model::validate((Result *)local_88,&local_60);
  bVar1 = CoreML::Result::good((Result *)local_88);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2ea);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  else {
    CoreML::Specification::Model::Clear(&local_60);
    nn = buildBasicUpdatableNeuralNetworkModel(&local_60);
    addMeanSquareError<CoreML::Specification::NeuralNetwork>
              (&local_60,nn,"mean_squared_error_loss_layer","B","label_target");
    CoreML::Model::validate((Result *)local_30,&local_60);
    local_88 = local_30;
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_p != &local_18) {
      operator_delete(local_28._M_p,local_18._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_88);
    iVar3 = 0;
    if (!bVar1) goto LAB_001a76af;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  std::ostream::put((char)poVar2);
  iVar3 = 1;
  std::ostream::flush();
LAB_001a76af:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_60);
  return iVar3;
}

Assistant:

int testMissingUpdatableModelParameters() {

    Specification::Model m;

    // basic neural network model with CCE and softmax without any updatable model parameters.
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);

    // expect validation to fail due to missing updatable model parameters.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);

    // clear model and redo test with MSE
    m.Clear();

    // basic neural network model with MSE without any updatable model parameters.
    buildBasicUpdatableModelWithMeanSquaredError(m);

    // expect validation to fail due to missing updatable model parameters.
    res = Model::validate(m);
    ML_ASSERT_BAD(res);

    return 0;
}